

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AvalancheTest.h
# Opt level: O1

bool BicTest3<Blob<88>,Blob<256>>(pfHash hash,int reps,bool verbose)

{
  ulong uVar1;
  int *piVar2;
  int b;
  uint32_t uVar3;
  uint32_t uVar4;
  void *__s;
  ulong uVar5;
  long lVar6;
  long lVar7;
  int iVar8;
  int keybit;
  ulong uVar9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  undefined1 auVar17 [64];
  undefined1 auVar18 [16];
  double dVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  undefined8 in_XMM7_Qb;
  Blob<88> key;
  Blob<256> h2;
  Blob<256> h1;
  Blob<256> d;
  uint local_104;
  uint local_f4;
  long local_e8;
  undefined7 local_b8;
  undefined4 uStack_b1;
  Rand local_a8;
  ulong local_98;
  ulong uStack_90;
  ulong uStack_88;
  ulong uStack_80;
  ulong local_78;
  ulong uStack_70;
  ulong uStack_68;
  ulong uStack_60;
  ulong local_58;
  ulong uStack_50;
  ulong uStack_48;
  ulong uStack_40;
  
  local_a8.x = 0x88e23b73;
  local_a8.y = 0x11310f6c;
  local_a8.z = 0x18847f4;
  local_a8.w = 0x1142a2ba;
  local_b8 = 0;
  uStack_b1 = 0;
  local_78 = 0;
  uStack_70 = 0;
  uStack_68 = 0;
  uStack_60 = 0;
  local_98 = 0;
  uStack_90 = 0;
  uStack_88 = 0;
  uStack_80 = 0;
  __s = operator_new(0x5800000);
  uVar12 = 0;
  memset(__s,0,0x5800000);
  local_e8 = (long)__s + 0x10;
  do {
    if ((uVar12 & 7) == 0) {
      putchar(0x2e);
    }
    if (0 < reps) {
      local_f4 = 0;
      do {
        Rand::rand_p(&local_a8,&local_b8,0xb);
        (*hash)(&local_b8,0xb,0,&local_78);
        flipbit(&local_b8,0xb,(uint32_t)uVar12);
        (*hash)(&local_b8,0xb,0,&local_98);
        local_58 = local_98 ^ local_78;
        uStack_50 = uStack_90 ^ uStack_70;
        uStack_48 = uStack_88 ^ uStack_68;
        uStack_40 = uStack_80 ^ uStack_60;
        lVar10 = -0xff;
        lVar7 = local_e8;
        lVar16 = 0;
        do {
          lVar6 = lVar16 + 1;
          lVar11 = lVar10;
          lVar15 = lVar7;
          do {
            uVar3 = getbit(&local_58,0x20,(uint32_t)lVar16);
            uVar4 = getbit(&local_58,0x20,(int)lVar11 + 0x100);
            piVar2 = (int *)(lVar15 + (ulong)(uVar4 * 2 | uVar3) * 4);
            *piVar2 = *piVar2 + 1;
            lVar15 = lVar15 + 0x10;
            lVar11 = lVar11 + 1;
          } while (lVar11 != 0);
          lVar7 = lVar7 + 0x1010;
          lVar10 = lVar10 + 1;
          lVar16 = lVar6;
        } while (lVar6 != 0xff);
        local_f4 = local_f4 + 1;
      } while (local_f4 != reps);
    }
    uVar12 = uVar12 + 1;
    local_e8 = local_e8 + 0x100000;
  } while (uVar12 != 0x58);
  putchar(10);
  lVar7 = (long)__s + 0x10;
  auVar17 = ZEXT864(0) << 0x40;
  uVar5 = 1;
  auVar21 = ZEXT1664(ZEXT816(0x4000000000000000));
  auVar22 = ZEXT1664(ZEXT816(0xbff0000000000000));
  auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
  uVar13 = 0;
  local_104 = 0;
  local_f4 = 0;
  uVar12 = 0;
  do {
    uVar1 = uVar12 + 1;
    uVar14 = uVar5;
    lVar16 = lVar7;
    do {
      if (verbose) {
        printf("(%3d,%3d) - ",uVar12 & 0xffffffff,uVar14 & 0xffffffff);
        auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar22 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar21 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar17 = ZEXT864(auVar17._0_8_);
      }
      uVar9 = 0;
      lVar10 = lVar16;
      do {
        auVar20 = ZEXT864(0) << 0x40;
        lVar6 = 0;
        do {
          auVar18._0_8_ = (double)*(int *)(lVar10 + lVar6 * 4) / (double)(reps / 2);
          auVar18._8_8_ = in_XMM7_Qb;
          auVar18 = vfmadd213sd_fma(auVar18,auVar21._0_16_,auVar22._0_16_);
          auVar18 = vandpd_avx(auVar18,auVar23._0_16_);
          auVar18 = vmaxsd_avx(auVar18,auVar20._0_16_);
          auVar20 = ZEXT1664(auVar18);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 4);
        dVar19 = auVar18._0_8_;
        if (auVar17._0_8_ < dVar19) {
          uVar13 = uVar9 & 0xffffffff;
          auVar17 = ZEXT1664(auVar18);
          local_104 = (uint)uVar12;
          local_f4 = (uint)uVar14;
        }
        if (verbose) {
          iVar8 = 0x2e;
          if ((0.01 <= dVar19) && (iVar8 = 0x6f, 0.05 <= dVar19)) {
            iVar8 = (uint)(0.33 <= dVar19) * 9 + 0x4f;
          }
          putchar(iVar8);
          auVar17 = ZEXT864(auVar17._0_8_);
          auVar21 = ZEXT1664(ZEXT816(0x4000000000000000));
          auVar22 = ZEXT1664(ZEXT816(0xbff0000000000000));
          auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        }
        uVar9 = uVar9 + 1;
        lVar10 = lVar10 + 0x100000;
      } while (uVar9 != 0x58);
      if (verbose) {
        putchar(10);
        auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
        auVar22 = ZEXT1664(ZEXT816(0xbff0000000000000));
        auVar21 = ZEXT1664(ZEXT816(0x4000000000000000));
        auVar17 = ZEXT864(auVar17._0_8_);
      }
      uVar14 = uVar14 + 1;
      lVar16 = lVar16 + 0x10;
    } while (uVar14 != 0x100);
    if (verbose) {
      iVar8 = 100;
      do {
        putchar(0x2d);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      putchar(10);
      auVar17 = ZEXT864(auVar17._0_8_);
      auVar21 = ZEXT1664(ZEXT816(0x4000000000000000));
      auVar22 = ZEXT1664(ZEXT816(0xbff0000000000000));
      auVar23 = ZEXT1664(CONCAT88(0x7fffffffffffffff,0x7fffffffffffffff));
    }
    uVar5 = uVar5 + 1;
    lVar7 = lVar7 + 0x1010;
    uVar12 = uVar1;
  } while (uVar1 != 0xff);
  printf("Max bias %f - (%3d : %3d,%3d)\n",uVar13,(ulong)local_104,(ulong)local_f4);
  operator_delete(__s);
  return auVar17._0_8_ < 0.05;
}

Assistant:

bool BicTest3 ( pfHash hash, const int reps, bool verbose = false )
{
  const int keybytes = sizeof(keytype);
  const int keybits = keybytes * 8;
  const int hashbytes = sizeof(hashtype);
  const int hashbits = hashbytes * 8;
  const int pagesize = hashbits*hashbits*4;

  Rand r(11938);

  double maxBias = 0;
  int maxK = 0;
  int maxA = 0;
  int maxB = 0;

  keytype key;
  hashtype h1,h2;

  std::vector<int> bins(keybits*pagesize,0);

  for(int keybit = 0; keybit < keybits; keybit++)
  {
    if(keybit % (keybits/10) == 0) printf(".");

    int * page = &bins[keybit*pagesize];

    for(int irep = 0; irep < reps; irep++)
    {
      r.rand_p(&key,keybytes);
      hash(&key,keybytes,0,&h1);
      flipbit(key,keybit);
      hash(&key,keybytes,0,&h2);

      hashtype d = h1 ^ h2;

      for(int out1 = 0; out1 < hashbits-1; out1++)
      for(int out2 = out1+1; out2 < hashbits; out2++)
      {
        int * b = &page[(out1*hashbits+out2)*4];

        uint32_t x = getbit(d,out1) | (getbit(d,out2) << 1);

        b[x]++;
      }
    }
  }

  printf("\n");

  for(int out1 = 0; out1 < hashbits-1; out1++)
  {
    for(int out2 = out1+1; out2 < hashbits; out2++)
    {
      if(verbose) printf("(%3d,%3d) - ",out1,out2);

      for(int keybit = 0; keybit < keybits; keybit++)
      {
        int * page = &bins[keybit*pagesize];
        int * bins = &page[(out1*hashbits+out2)*4];

        double bias = 0;

        for(int b = 0; b < 4; b++)
        {
          double b2 = double(bins[b]) / double(reps / 2);
          b2 = fabs(b2 * 2 - 1);

          if(b2 > bias) bias = b2;
        }

        if(bias > maxBias)
        {
          maxBias = bias;
          maxK = keybit;
          maxA = out1;
          maxB = out2;
        }

        if(verbose) 
        {
          if     (bias < 0.01) printf(".");
          else if(bias < 0.05) printf("o");
          else if(bias < 0.33) printf("O");
          else                 printf("X");
        }
      }

      // Finished keybit
      if(verbose) printf("\n");
    }

    if(verbose)
    {
      for(int i = 0; i < keybits+12; i++) printf("-");
      printf("\n");
    }
  }

  printf("Max bias %f - (%3d : %3d,%3d)\n",maxBias,maxK,maxA,maxB);

  // Bit independence is harder to pass than avalanche, so we're a bit more lax here.
  bool result = (maxBias < 0.05);
  return result;
}